

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# go_construct.cc
# Opt level: O3

void __thiscall re2c::If::If(If *this,type_t t,Span *sp,uint32_t nsp,State *next)

{
  Binary *this_00;
  
  this->type = t;
  (this->info).binary = (Binary *)0x0;
  if (t == LINEAR) {
    this_00 = (Binary *)operator_new(0x18);
    Linear::Linear((Linear *)this_00,sp,nsp,next);
  }
  else {
    if (t != BINARY) {
      return;
    }
    this_00 = (Binary *)operator_new(0x18);
    Binary::Binary(this_00,sp,nsp,next);
  }
  (this->info).binary = this_00;
  return;
}

Assistant:

If::If (type_t t, const Span * sp, uint32_t nsp, const State * next)
	: type (t)
	, info ()
{
	switch (type)
	{
		case BINARY:
			info.binary = new Binary (sp, nsp, next);
			break;
		case LINEAR:
			info.linear = new Linear (sp, nsp, next);
			break;
	}
}